

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.c
# Opt level: O0

sptr_t wal_write_mips(sptr_t buf,image_data *im,size_t mips,uint32_t *offsets)

{
  sptr_t sVar1;
  image_data *local_78;
  uchar *out;
  uchar *ptr;
  size_t height;
  size_t width;
  size_t bytes_written;
  int local_48;
  int y;
  int x;
  int mip_num;
  uint32_t *offsets_local;
  size_t mips_local;
  image_data *im_local;
  sptr_t buf_local;
  
  buf_local.ptr = (uchar *)buf.size;
  local_78 = (image_data *)buf.ptr;
  width = 0;
  height = (size_t)im->width;
  ptr = (uchar *)(ulong)im->height;
  out = (uchar *)0x0;
  _x = offsets;
  offsets_local = (uint32_t *)mips;
  mips_local = (size_t)im;
  im_local = local_78;
  for (y = 0; (uint32_t *)(long)y < offsets_local; y = y + 1) {
    _x[y] = (uint32_t)width;
    out = *(uchar **)mips_local;
    for (bytes_written._4_4_ = 0; (uchar *)(long)bytes_written._4_4_ < ptr;
        bytes_written._4_4_ = (1 << ((byte)y & 0x1f)) + bytes_written._4_4_) {
      for (local_48 = 0; (ulong)(long)local_48 < height;
          local_48 = (1 << ((byte)y & 0x1f)) + local_48) {
        write_8(out[(long)local_48 + height * (long)bytes_written._4_4_],(uchar **)&local_78);
        width = width + 1;
      }
    }
  }
  sVar1.size = (size_t)buf_local.ptr;
  sVar1.ptr = (uchar *)im_local;
  sVar1 = sptr_advance(sVar1,width);
  return sVar1;
}

Assistant:

static sptr_t wal_write_mips(sptr_t buf, const struct image_data *im,
							 size_t mips, uint32_t *offsets)
{
	int mip_num, x, y;
	size_t bytes_written = 0, width = im->width, height = im->height;
	unsigned char *ptr = NULL;
	unsigned char *out = buf.ptr;
	for (mip_num = 0; mip_num < mips; mip_num++) {
		offsets[mip_num] = bytes_written;
		ptr = im->pixels.ptr;
		for (y = 0; y < height; y += 1 << mip_num) {
			for (x = 0; x < width; x += 1 << mip_num) {
				write_8(ptr[x + width * y], &out);
				bytes_written++;
			}
		}
	}
	return sptr_advance(buf, bytes_written);
}